

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MultiIterFinishSetup(Fts5Index *p,Fts5Iter *pIter)

{
  int iChanged;
  int iVar1;
  
  iVar1 = pIter->nSeg;
  while (1 < iVar1) {
    iVar1 = iVar1 + -1;
    iChanged = fts5MultiIterDoCompare(pIter,iVar1);
    if (iChanged != 0) {
      if (p->rc == 0) {
        (*pIter->aSeg[iChanged].xNext)(p,pIter->aSeg + iChanged,(int *)0x0);
      }
      fts5MultiIterAdvanced(p,pIter,iChanged,iVar1);
    }
  }
  fts5MultiIterSetEof(pIter);
  if (pIter->bSkipEmpty != '\0') {
    iVar1 = fts5MultiIterIsEmpty(p,pIter);
    if (iVar1 != 0) goto LAB_001c9afb;
  }
  iVar1 = fts5MultiIterIsDeleted(pIter);
  if (iVar1 == 0) {
    if ((pIter->base).bEof != '\0') {
      return;
    }
    (*pIter->xSetOutputs)(pIter,pIter->aSeg + pIter->aFirst[1].iFirst);
    return;
  }
LAB_001c9afb:
  fts5MultiIterNext(p,pIter,0,0);
  return;
}

Assistant:

static void fts5MultiIterFinishSetup(Fts5Index *p, Fts5Iter *pIter){
  int iIter;
  for(iIter=pIter->nSeg-1; iIter>0; iIter--){
    int iEq;
    if( (iEq = fts5MultiIterDoCompare(pIter, iIter)) ){
      Fts5SegIter *pSeg = &pIter->aSeg[iEq];
      if( p->rc==SQLITE_OK ) pSeg->xNext(p, pSeg, 0);
      fts5MultiIterAdvanced(p, pIter, iEq, iIter);
    }
  }
  fts5MultiIterSetEof(pIter);
  fts5AssertMultiIterSetup(p, pIter);

  if( (pIter->bSkipEmpty && fts5MultiIterIsEmpty(p, pIter))
   || fts5MultiIterIsDeleted(pIter)
  ){
    fts5MultiIterNext(p, pIter, 0, 0);
  }else if( pIter->base.bEof==0 ){
    Fts5SegIter *pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
    pIter->xSetOutputs(pIter, pSeg);
  }
}